

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::DiffuseAreaLight::L
          (DiffuseAreaLight *this,Point3f p,Normal3f n,Point2f uv,Vector3f w,
          SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Float *pFVar3;
  int c;
  int c_00;
  Float FVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [64];
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  undefined1 in_register_000012c4 [12];
  undefined8 in_XMM4_Qb;
  undefined8 in_XMM5_Qb;
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  SampledSpectrum SVar18;
  Float local_84;
  Float local_80;
  Float local_7c;
  undefined1 local_78 [8];
  Float FStack_70;
  Float FStack_6c;
  SampledWavelengths *local_60;
  RGB local_58;
  RGBIlluminantSpectrum local_48;
  undefined1 auVar7 [64];
  undefined1 auVar9 [56];
  undefined1 auVar12 [64];
  undefined1 auVar14 [56];
  
  auVar15._8_56_ = n._8_56_;
  auVar15._0_8_ = n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar9 = p._16_56_;
  auVar16._4_60_ = w._12_60_;
  auVar16._0_4_ = w.super_Tuple3<pbrt::Vector3,_float>.z;
  if (this->twoSided == false) {
    auVar5 = vmovshdup_avx(auVar15._0_16_);
    auVar17._8_8_ = in_XMM5_Qb;
    auVar17._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11 = vmovshdup_avx(auVar17);
    auVar17 = ZEXT416((uint)(n.super_Tuple3<pbrt::Normal3,_float>.z * auVar16._0_4_));
    auVar5 = vfmadd213ss_fma(auVar11,auVar5,auVar17);
    auVar11._4_12_ = in_register_000012c4;
    auVar11._0_4_ = n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar11 = vfmsub213ss_fma(auVar16._0_16_,auVar11,auVar17);
    uVar10 = 0;
    auVar9 = ZEXT856(0);
    auVar2._8_8_ = in_XMM5_Qb;
    auVar2._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ + auVar11._0_4_)),auVar2,auVar15._0_16_);
    auVar6._0_8_ = 0;
    if (auVar5._0_4_ < 0.0) goto LAB_0033db65;
  }
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    FVar4 = this->scale;
    local_78._4_4_ = FVar4;
    local_78._0_4_ = FVar4;
    FStack_70 = FVar4;
    FStack_6c = FVar4;
    auVar14 = ZEXT856(local_78._8_8_);
    SVar18 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
    auVar13._0_8_ = SVar18.values.values._8_8_;
    auVar13._8_56_ = auVar9;
    auVar11 = auVar13._0_16_;
    auVar8._0_8_ = SVar18.values.values._0_8_;
    auVar8._8_56_ = auVar14;
    auVar5 = auVar8._0_16_;
  }
  else {
    auVar5._8_8_ = in_XMM4_Qb;
    auVar5._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
    auVar5 = vmovshdup_avx(auVar5);
    c_00 = 0;
    local_7c = 0.0;
    local_84 = 0.0;
    local_80 = 0.0;
    auVar1._8_8_ = in_XMM4_Qb;
    auVar1._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
    _local_78 = vinsertps_avx(auVar1,ZEXT416((uint)(1.0 - auVar5._0_4_)),0x10);
    local_60 = lambda;
    do {
      FVar4 = Image::BilerpChannel(&this->image,(Point2f)local_78,c_00,(WrapMode2D)0x200000002);
      pFVar3 = &local_7c;
      if ((c_00 != 0) && (pFVar3 = &local_80, c_00 == 1)) {
        pFVar3 = &local_84;
      }
      c_00 = c_00 + 1;
      *pFVar3 = FVar4;
    } while (c_00 != 3);
    local_78._4_4_ = this->scale;
    local_78._0_4_ = local_78._4_4_;
    FStack_70 = (Float)local_78._4_4_;
    FStack_6c = (Float)local_78._4_4_;
    auVar5 = vinsertps_avx(ZEXT416((uint)local_7c),ZEXT416((uint)local_84),0x10);
    auVar5 = vmaxps_avx(auVar5,ZEXT816(0) << 0x40);
    auVar9 = ZEXT856(auVar5._8_8_);
    local_58._0_8_ = vmovlps_avx(auVar5);
    auVar5 = vmaxss_avx(ZEXT416((uint)local_80),ZEXT816(0) << 0x40);
    auVar14 = ZEXT856(auVar5._8_8_);
    local_58.b = auVar5._0_4_;
    RGBIlluminantSpectrum::RGBIlluminantSpectrum(&local_48,this->imageColorSpace,&local_58);
    SVar18 = RGBIlluminantSpectrum::Sample(&local_48,local_60);
    auVar12._0_8_ = SVar18.values.values._8_8_;
    auVar12._8_56_ = auVar14;
    auVar11 = auVar12._0_16_;
    auVar7._0_8_ = SVar18.values.values._0_8_;
    auVar7._8_56_ = auVar9;
    auVar5 = auVar7._0_16_;
  }
  auVar5 = vmovlhps_avx(auVar5,auVar11);
  auVar6._0_8_ = CONCAT44(auVar5._4_4_ * (float)local_78._4_4_,auVar5._0_4_ * (float)local_78._0_4_)
  ;
  auVar6._8_4_ = auVar5._8_4_ * FStack_70;
  auVar6._12_4_ = auVar5._12_4_ * FStack_6c;
  auVar5 = vshufpd_avx(auVar6,auVar6,1);
  uVar10 = auVar5._0_8_;
LAB_0033db65:
  SVar18.values.values[2] = (float)(int)uVar10;
  SVar18.values.values[3] = (float)(int)((ulong)uVar10 >> 0x20);
  SVar18.values.values[0] = (float)(int)auVar6._0_8_;
  SVar18.values.values[1] = (float)(int)((ulong)auVar6._0_8_ >> 0x20);
  return (SampledSpectrum)SVar18.values.values;
}

Assistant:

L(Point3f p, Normal3f n, Point2f uv, Vector3f w,
                      const SampledWavelengths &lambda) const {
        if (!twoSided && Dot(n, w) < 0)
            return SampledSpectrum(0.f);
        if (image) {
            // Return _DiffuseAreaLight_ emission using image
            RGB rgb;
            Point2f st = uv;
            st[1] = 1 - st[1];
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.BilerpChannel(st, c);
            return scale *
                   RGBIlluminantSpectrum(*imageColorSpace, ClampZero(rgb)).Sample(lambda);

        } else
            return scale * Lemit.Sample(lambda);
    }